

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteTest.h
# Opt level: O2

void UnitTest::
     ExecuteTest<UnitTest::(anonymous_namespace)::DeferredTestReporterFixtureReportFailureSavesFailureDetailsForMultipleFailuresHelper>
               (DeferredTestReporterFixtureReportFailureSavesFailureDetailsForMultipleFailuresHelper
                *testObject,TestDetails *details)

{
  TestDetails *details_00;
  TestResults *pTVar1;
  pointer ppVar2;
  int iVar3;
  TestDetails **ppTVar4;
  DeferredTestResultList *this;
  reference pvVar5;
  TestResults **ppTVar6;
  undefined8 *puVar7;
  int local_4c8 [2];
  TestDetails local_4c0;
  char *failure2;
  char *failure1;
  SignalTranslator sig;
  
  ppTVar4 = CurrentTest::Details();
  *ppTVar4 = details;
  SignalTranslator::SignalTranslator(&sig);
  iVar3 = __sigsetjmp(SignalTranslator::s_jumpTarget,1);
  if (iVar3 == 0) {
    failure1 = "failure 1";
    failure2 = "failure 2";
    details_00 = &(testObject->super_DeferredTestReporterFixture).details;
    DeferredTestReporter::ReportTestStart((DeferredTestReporter *)testObject,details_00);
    DeferredTestReporter::ReportFailure((DeferredTestReporter *)testObject,details_00,"failure 1");
    DeferredTestReporter::ReportFailure((DeferredTestReporter *)testObject,details_00,"failure 2");
    this = DeferredTestReporter::GetResults((DeferredTestReporter *)testObject);
    pvVar5 = std::
             vector<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>::at
                       (this,0);
    ppTVar6 = CurrentTest::Results();
    pTVar1 = *ppTVar6;
    local_4c8[1] = 2;
    local_4c8[0] = (int)(((long)(pvVar5->failures).
                                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar5->failures).
                               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x28);
    ppTVar4 = CurrentTest::Details();
    TestDetails::TestDetails(&local_4c0,*ppTVar4,0x5d);
    CheckEqual<int,int>(pTVar1,local_4c8 + 1,local_4c8,&local_4c0);
    ppTVar6 = CurrentTest::Results();
    pTVar1 = *ppTVar6;
    ppVar2 = (pvVar5->failures).
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppTVar4 = CurrentTest::Details();
    TestDetails::TestDetails(&local_4c0,*ppTVar4,0x5e);
    CheckEqual<char_const*,std::__cxx11::string>(pTVar1,&failure1,&ppVar2->second,&local_4c0);
    ppTVar6 = CurrentTest::Results();
    pTVar1 = *ppTVar6;
    ppVar2 = (pvVar5->failures).
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppTVar4 = CurrentTest::Details();
    TestDetails::TestDetails(&local_4c0,*ppTVar4,0x5f);
    CheckEqual<char_const*,std::__cxx11::string>(pTVar1,&failure2,&ppVar2[1].second,&local_4c0);
    SignalTranslator::~SignalTranslator(&sig);
    return;
  }
  puVar7 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar7 = "Unhandled system exception";
  __cxa_throw(puVar7,&char_const*::typeinfo,0);
}

Assistant:

void ExecuteTest(T& testObject, TestDetails const& details)
{
	CurrentTest::Details() = &details;

	try
	{
#ifdef UNITTEST_POSIX
		UNITTEST_THROW_SIGNALS
#endif
		testObject.RunImpl();
	}
	catch (AssertException const& e)
	{
		CurrentTest::Results()->OnTestFailure(
			TestDetails(details.testName, details.suiteName, e.Filename(), e.LineNumber()), e.what());
	}
	catch (std::exception const& e)
	{
		MemoryOutStream stream;
		stream << "Unhandled exception: " << e.what();
		CurrentTest::Results()->OnTestFailure(details, stream.GetText());
	}
	catch (...)
	{
		CurrentTest::Results()->OnTestFailure(details, "Unhandled exception: Crash!");
	}
}